

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_MonsterRail
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  double x;
  bool bVar8;
  int iVar9;
  AActor *pAVar10;
  AActor *pAVar11;
  AActor *other;
  char *__assertion;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  DVector2 xydiff;
  FTranslatedLineTarget t;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0040171c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    other = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (other != (AActor *)0x0) {
        bVar8 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
        if (!bVar8) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0040171c;
        }
        goto LAB_00401466;
      }
    }
    else if (other != (AActor *)0x0) goto LAB_0040170c;
    other = (AActor *)0x0;
LAB_00401466:
    obj = &other->target;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar10 != (AActor *)0x0) {
      uVar7 = (other->flags).Value;
      if ((uVar7 >> 0x1e & 1) != 0) {
        other->visdir = '\x01';
      }
      dVar1 = (other->Angles).Pitch.Degrees;
      (other->flags).Value = uVar7 & 0xffffffdf;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::AngleTo((AActor *)&xydiff,other,SUB81(pAVar10,0));
      (other->Angles).Yaw.Degrees = xydiff.X;
      local_d8 = (undefined1  [8])xydiff.X;
      local_e0 = 0x404e000000000000;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      P_AimLineAttack((AActor *)&xydiff,(DAngle *)other,2048.0,(FTranslatedLineTarget *)local_d8,
                      (DAngle *)&t,(int)&local_e0,(AActor *)0x0,pAVar10);
      (other->Angles).Pitch.Degrees = xydiff.X;
      if (t.linetarget == (AActor *)0x0) {
        GC::ReadBarrier<AActor>((AActor **)obj);
        AActor::Vec2To((AActor *)&xydiff,other);
        pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar2 = (pAVar10->__Pos).Z;
        dVar3 = pAVar10->Height;
        dVar4 = other->Height;
        dVar5 = (other->__Pos).Z;
        dVar6 = other->Floorclip;
        x = TVector2<double>::Length((TVector2<double> *)&xydiff);
        dVar2 = c_atan2(((dVar2 + dVar3 * 0.5) - (dVar5 + dVar4 * 0.5)) - dVar6,x);
        (other->Angles).Pitch.Degrees = dVar2 * -57.29577951308232;
      }
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar2 = (pAVar11->Vel).X;
      pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::AngleTo((AActor *)&xydiff,other,dVar2 * -3.0,(pAVar11->Vel).Y * -3.0,SUB81(pAVar10,0))
      ;
      (other->Angles).Yaw.Degrees = xydiff.X;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      if ((((pAVar10->flags).Value & 0x40000) != 0) && (((other->flags6).Value & 0x1000000) == 0)) {
        iVar9 = FRandom::Random2(&pr_railface);
        (other->Angles).Yaw.Degrees =
             (double)iVar9 * 45.0 * 0.00390625 + (other->Angles).Yaw.Degrees;
      }
      xydiff.X = (double)other;
      xydiff.Y._0_4_ = AActor::GetMissileDamage(other,0,1);
      P_RailAttack((FRailParams *)&xydiff);
      (other->Angles).Pitch.Degrees = dVar1;
    }
    return 0;
  }
LAB_0040170c:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0040171c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc34,
                "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRail)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (!self->target)
		return 0;

	DAngle saved_pitch = self->Angles.Pitch;
	FTranslatedLineTarget t;

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;
		
	self->Angles.Yaw = self->AngleTo(self->target);

	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, self->target);
	if (t.linetarget == NULL)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}

	// Let the aim trail behind the player
	self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

	if (self->target->flags & MF_SHADOW && !(self->flags6 & MF6_SEEINVISIBLE))
	{
		self->Angles.Yaw += pr_railface.Random2() * 45./256;
	}

	FRailParams p;

	p.source = self;
	p.damage = self->GetMissileDamage(0, 1);
	P_RailAttack (&p);
	self->Angles.Pitch = saved_pitch;
	return 0;
}